

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

sqlite3_pcache * pcache1Create(int szPage,int szExtra,int bPurgeable)

{
  uint uVar1;
  PGroup *pPVar2;
  int iVar3;
  PCache1 *p;
  u64 n;
  PCacheGlobal *pPVar4;
  
  iVar3 = sqlite3Config.bCoreMutex;
  n = 0x38;
  if (0 < sqlite3Config.bCoreMutex) {
    n = 0x60;
  }
  p = (PCache1 *)sqlite3Malloc(n);
  if (p != (PCache1 *)0x0) {
    memset(p,0,n);
    if (iVar3 < 1) {
      pPVar4 = &pcache1_g;
    }
    else {
      pPVar4 = (PCacheGlobal *)(p + 1);
      p[1].bPurgeable = 10;
    }
    p->pGroup = &pPVar4->grp;
    p->szPage = szPage;
    p->szExtra = szExtra;
    p->bPurgeable = (uint)(bPurgeable != 0);
    pPVar2 = (PGroup *)(pPVar4->grp).mutex;
    if (pPVar2 != (PGroup *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)((sqlite3_mutex *)pPVar2);
    }
    pcache1ResizeHash(p);
    if (bPurgeable != 0) {
      p->nMin = 10;
      uVar1 = (pPVar4->grp).nMinPage;
      (pPVar4->grp).nMinPage = uVar1 + 10;
      (pPVar4->grp).mxPinned = (pPVar4->grp).nMaxPage - uVar1;
    }
    pPVar2 = (PGroup *)(pPVar4->grp).mutex;
    if (pPVar2 != (PGroup *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)((sqlite3_mutex *)pPVar2);
    }
    if (p->nHash != 0) {
      return (sqlite3_pcache *)p;
    }
    pcache1Destroy((sqlite3_pcache *)p);
  }
  return (sqlite3_pcache *)0x0;
}

Assistant:

static sqlite3_pcache *pcache1Create(int szPage, int szExtra, int bPurgeable){
  PCache1 *pCache;      /* The newly created page cache */
  PGroup *pGroup;       /* The group the new page cache will belong to */
  int sz;               /* Bytes of memory required to allocate the new cache */

  /*
  ** The separateCache variable is true if each PCache has its own private
  ** PGroup.  In other words, separateCache is true for mode (1) where no
  ** mutexing is required.
  **
  **   *  Always use a unified cache (mode-2) if ENABLE_MEMORY_MANAGEMENT
  **
  **   *  Always use a unified cache in single-threaded applications
  **
  **   *  Otherwise (if multi-threaded and ENABLE_MEMORY_MANAGEMENT is off)
  **      use separate caches (mode-1)
  */
#if defined(SQLITE_ENABLE_MEMORY_MANAGEMENT) || SQLITE_THREADSAFE==0
  const int separateCache = 0;
#else
  int separateCache = sqlite3GlobalConfig.bCoreMutex>0;
#endif

  assert( (szPage & (szPage-1))==0 && szPage>=512 && szPage<=65536 );
  assert( szExtra < 300 );

  sz = sizeof(PCache1) + sizeof(PGroup)*separateCache;
  pCache = (PCache1 *)sqlite3MallocZero(sz);
  if( pCache ){
    if( separateCache ){
      pGroup = (PGroup*)&pCache[1];
      pGroup->mxPinned = 10;
    }else{
      pGroup = &pcache1.grp;
    }
    pCache->pGroup = pGroup;
    pCache->szPage = szPage;
    pCache->szExtra = szExtra;
    pCache->bPurgeable = (bPurgeable ? 1 : 0);
    pcache1EnterMutex(pGroup);
    pcache1ResizeHash(pCache);
    if( bPurgeable ){
      pCache->nMin = 10;
      pGroup->nMinPage += pCache->nMin;
      pGroup->mxPinned = pGroup->nMaxPage + 10 - pGroup->nMinPage;
    }
    pcache1LeaveMutex(pGroup);
    if( pCache->nHash==0 ){
      pcache1Destroy((sqlite3_pcache*)pCache);
      pCache = 0;
    }
  }
  return (sqlite3_pcache *)pCache;
}